

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

void __thiscall
SpecificStrategy::matchAddresses
          (SpecificStrategy *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *aInstrs,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *bInstrs)

{
  bool bVar1;
  reference __x;
  _Self local_40;
  iterator aED;
  iterator aIT;
  iterator bED;
  iterator bIT;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *bInstrs_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *aInstrs_local;
  SpecificStrategy *this_local;
  
  bED = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                  (bInstrs);
  aIT = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                  (bInstrs);
  while (bVar1 = std::operator!=(&bED,&aIT), bVar1) {
    __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&bED);
    aED = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                    (aInstrs,__x);
    local_40._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                   (aInstrs);
    bVar1 = std::operator!=(&aED,&local_40);
    if (bVar1) {
      bED = std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
            erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)bInstrs,bED._M_node);
    }
    else {
      std::_Rb_tree_const_iterator<unsigned_long>::operator++(&bED,0);
    }
  }
  return;
}

Assistant:

void SpecificStrategy::matchAddresses(std::set<Addr>& aInstrs, std::set<Addr>& bInstrs) {
	for (std::set<Addr>::iterator bIT = bInstrs.begin(),
			bED = bInstrs.end(); bIT != bED; ) {
		std::set<Addr>::iterator aIT = aInstrs.find(*bIT),
				aED = aInstrs.end();
		if (aIT != aED) {
			bIT = bInstrs.erase(bIT);
		} else {
			bIT++;
		}
	}
}